

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O0

void __thiscall FIX::ExeceptionStore::reset(ExeceptionStore *this)

{
  IOException *this_00;
  allocator<char> local_31;
  string local_30;
  ExeceptionStore *local_10;
  ExeceptionStore *this_local;
  
  local_10 = this;
  this_00 = (IOException *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"reset IOException",&local_31);
  IOException::IOException(this_00,&local_30);
  __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

void reset() EXCEPT ( IOException ) {throw IOException("reset IOException");}